

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue::IfcPropertyEnumeratedValue
          (IfcPropertyEnumeratedValue *this)

{
  IfcPropertyEnumeratedValue *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xa0,"IfcPropertyEnumeratedValue");
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__00f51e80);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>,
             &PTR_construction_vtable_24__00f51ec8);
  *(undefined8 *)this = 0xf51df0;
  *(undefined8 *)&this->field_0xa0 = 0xf51e68;
  *(undefined8 *)&this->field_0x58 = 0xf51e18;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0xf51e40;
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyEnumeratedValue,_2UL>).
              field_0x10);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>::Maybe
            (&this->EnumerationReference);
  return;
}

Assistant:

IfcPropertyEnumeratedValue() : Object("IfcPropertyEnumeratedValue") {}